

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_neon_negl(TCGContext_conflict1 *tcg_ctx,TCGv_i64 var,int size)

{
  code *func;
  TCGTemp *args [1];
  TCGTemp *local_8;
  
  if (size != 2) {
    local_8 = (TCGTemp *)(var + (long)tcg_ctx);
    if (size == 1) {
      func = helper_neon_negl_u32_aarch64;
    }
    else {
      func = helper_neon_negl_u16_aarch64;
    }
    tcg_gen_callN_aarch64(tcg_ctx,func,local_8,1,&local_8);
    return;
  }
  tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_neg_i64,(TCGArg)(var + (long)tcg_ctx),
                      (TCGArg)(var + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_neon_negl(TCGContext *tcg_ctx, TCGv_i64 var, int size)
{
    switch (size) {
    case 0: gen_helper_neon_negl_u16(tcg_ctx, var, var); break;
    case 1: gen_helper_neon_negl_u32(tcg_ctx, var, var); break;
    case 2:
        tcg_gen_neg_i64(tcg_ctx, var, var);
        break;
    default: abort();
    }
}